

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O3

void __thiscall cfd::core::DescriptorNode::AnalyzeKey(DescriptorNode *this)

{
  undefined8 uVar1;
  pointer puVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  pointer puVar6;
  ulong *puVar7;
  size_t sVar8;
  CfdException *pCVar9;
  ulong uVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  _Alloc_hider _Var12;
  size_t __n;
  long lVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  ulong uVar14;
  bool is_compressed;
  ByteData bytes;
  string errmsg;
  string path;
  string hdkey_top;
  undefined1 local_248 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_220;
  pointer puStack_218;
  pointer local_210;
  pointer local_208;
  pointer puStack_200;
  pointer local_1f8;
  pointer local_1f0;
  pointer puStack_1e8;
  pointer puStack_1e0;
  pointer local_1d8;
  bool local_1d0;
  undefined7 uStack_1cf;
  pointer local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  undefined1 local_198 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_170;
  pointer puStack_168;
  pointer local_160;
  pointer local_158;
  pointer puStack_150;
  pointer local_148;
  pointer local_140;
  pointer local_138;
  pointer puStack_130;
  pointer local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  ExtPubkey local_f8;
  ByteData local_88;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  ByteData256 local_48;
  
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->key_info_;
  ::std::__cxx11::string::_M_assign((string *)args);
  if ((*(this->value_)._M_dataplus._M_p == '[') &&
     (lVar5 = ::std::__cxx11::string::find((char *)&this->value_,0x5a87c3,0), lVar5 != -1)) {
    ::std::__cxx11::string::substr((ulong)local_248,(ulong)&this->value_);
    ::std::__cxx11::string::operator=((string *)args,(string *)local_248);
    if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
      operator_delete((void *)local_248._0_8_);
    }
  }
  local_248._0_8_ = "cfdcore_descriptor.cpp";
  local_248._8_4_ = 0x45e;
  local_248._16_8_ = "AnalyzeKey";
  logger::log<std::__cxx11::string&>
            ((CfdSourceLocation *)local_248,kCfdLogLevelInfo,"key_info_ = {}",args);
  local_70 = local_60;
  local_68 = 0;
  local_60[0] = 0;
  if (4 < (this->key_info_)._M_string_length) {
    ::std::__cxx11::string::substr((ulong)local_248,(ulong)args);
    ::std::__cxx11::string::operator=((string *)&local_70,(string *)local_248);
    if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
      operator_delete((void *)local_248._0_8_);
    }
  }
  iVar4 = ::std::__cxx11::string::compare((char *)&local_70);
  if ((iVar4 == 0) || (iVar4 = ::std::__cxx11::string::compare((char *)&local_70), iVar4 == 0)) {
    this->key_type_ = kDescriptorKeyBip32;
    iVar4 = ::std::__cxx11::string::compare((char *)&local_70);
    if (iVar4 == 0) {
      this->key_type_ = kDescriptorKeyBip32Priv;
    }
    ExtPubkey::ExtPubkey(&local_f8);
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    local_118._M_string_length = 0;
    local_118.field_2._M_allocated_capacity =
         local_118.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    local_1b8._M_string_length = 0;
    local_1b8.field_2._M_local_buf[0] = '\0';
    local_248._0_8_ = local_248 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"/","");
    StringUtil::Split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_1d0,args,(string *)local_248);
    if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
      operator_delete((void *)local_248._0_8_);
    }
    ::std::__cxx11::string::_M_assign((string *)&local_1b8);
    if ((ulong)((long)local_1c8 - CONCAT71(uStack_1cf,local_1d0)) < 0x21) {
      bVar3 = false;
    }
    else {
      lVar5 = ::std::__cxx11::string::find((char *)args,0x4ddb5c,0);
      if (lVar5 != -1) {
        this->need_arg_num_ = 1;
      }
      lVar5 = CONCAT71(uStack_1cf,local_1d0);
      uVar14 = (long)local_1c8 - lVar5;
      if (uVar14 < 0x21) {
        uVar10 = 2;
        bVar3 = false;
      }
      else {
        uVar10 = 1;
        lVar13 = 0x20;
        local_50 = args;
        do {
          iVar4 = ::std::__cxx11::string::compare((char *)(lVar5 + lVar13));
          lVar5 = CONCAT71(uStack_1cf,local_1d0);
          if (iVar4 == 0) break;
          iVar4 = ::std::__cxx11::string::compare((char *)(lVar5 + lVar13));
          bVar3 = true;
          lVar5 = CONCAT71(uStack_1cf,local_1d0);
          if (iVar4 == 0) goto LAB_004120fb;
          iVar4 = ::std::__cxx11::string::compare((char *)(lVar5 + lVar13));
          if (iVar4 == 0) {
            lVar5 = CONCAT71(uStack_1cf,local_1d0);
            goto LAB_004120fb;
          }
          if (uVar10 == 1) {
            puVar7 = (ulong *)(CONCAT71(uStack_1cf,local_1d0) + 0x20);
          }
          else {
            ::std::__cxx11::string::append((char *)&local_118);
            puVar7 = (ulong *)(CONCAT71(uStack_1cf,local_1d0) + lVar13);
          }
          ::std::__cxx11::string::_M_append((char *)&local_118,*puVar7);
          uVar10 = uVar10 + 1;
          lVar5 = CONCAT71(uStack_1cf,local_1d0);
          lVar13 = lVar13 + 0x20;
        } while (uVar10 < (ulong)((long)local_1c8 - lVar5 >> 5));
        bVar3 = false;
LAB_004120fb:
        uVar14 = (long)local_1c8 - lVar5;
        uVar10 = uVar10 + 1;
        args = local_50;
      }
      if (uVar10 < (ulong)((long)uVar14 >> 5)) {
        local_248._0_8_ = "cfdcore_descriptor.cpp";
        local_248._8_4_ = 0x480;
        local_248._16_8_ = "AnalyzeKey";
        logger::log<>((CfdSourceLocation *)local_248,kCfdLogLevelWarning,
                      "Failed to extkey path. A \'*\' can only be specified at the end.");
        pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
        local_248._0_8_ = local_248 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_248,
                   "Failed to extkey path. A \'*\' can only be specified at the end.","");
        CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)local_248);
        __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
      }
    }
    local_248._0_8_ = "cfdcore_descriptor.cpp";
    local_248._8_4_ = 0x489;
    puVar6 = local_248 + 0x10;
    local_248._16_8_ = "AnalyzeKey";
    logger::log<std::__cxx11::string&,std::__cxx11::string&>
              ((CfdSourceLocation *)local_248,kCfdLogLevelInfo,"key = {}, path = {}",&local_1b8,
               &local_118);
    if (this->key_type_ == kDescriptorKeyBip32Priv) {
      ExtPrivkey::ExtPrivkey((ExtPrivkey *)local_248,&local_1b8);
      ::std::__cxx11::string::_M_assign((string *)&this->base_extkey_);
      if ((pointer)local_118._M_string_length != (pointer)0x0) {
        ExtPrivkey::DerivePrivkey((ExtPrivkey *)local_198,(ExtPrivkey *)local_248,&local_118);
        uVar1 = local_248._0_8_;
        local_248._0_8_ = local_198._0_8_;
        local_248._8_8_ = local_198._8_8_;
        local_248._16_8_ = local_198._16_8_;
        local_198._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_198._8_8_ = (pointer)0x0;
        local_198._16_8_ = (pointer)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar1 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete((void *)uVar1);
        }
        paVar11 = local_220;
        local_248._24_8_ = local_198._24_8_;
        local_248._32_8_ = local_198._32_8_;
        local_220 = local_170;
        puStack_218 = puStack_168;
        local_210 = local_160;
        local_170 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
        puStack_168 = (pointer)0x0;
        local_160 = (pointer)0x0;
        if (paVar11 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(paVar11);
        }
        puVar6 = local_208;
        local_208 = local_158;
        puStack_200 = puStack_150;
        local_1f8 = local_148;
        local_158 = (pointer)0x0;
        puStack_150 = (pointer)0x0;
        local_148 = (pointer)0x0;
        if (puVar6 != (pointer)0x0) {
          operator_delete(puVar6);
        }
        puVar6 = puStack_1e8;
        local_1f0 = local_140;
        puStack_1e8 = local_138;
        puStack_1e0 = puStack_130;
        local_1d8 = local_128;
        local_138 = (pointer)0x0;
        puStack_130 = (pointer)0x0;
        local_128 = (pointer)0x0;
        if ((puVar6 != (pointer)0x0) && (operator_delete(puVar6), local_138 != (pointer)0x0)) {
          operator_delete(local_138);
        }
        if (local_158 != (pointer)0x0) {
          operator_delete(local_158);
        }
        if (local_170 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_170);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete((void *)local_198._0_8_);
        }
      }
      ExtPrivkey::ToString_abi_cxx11_((string *)local_198,(ExtPrivkey *)local_248);
      ::std::__cxx11::string::operator=((string *)args,(string *)local_198);
      if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
        operator_delete((void *)local_198._0_8_);
      }
      ExtPrivkey::GetPubTweakSum(&local_48,(ExtPrivkey *)local_248);
      ByteData256::GetHex_abi_cxx11_((string *)local_198,&local_48);
      ::std::__cxx11::string::operator=((string *)&this->tweak_sum_,(string *)local_198);
      if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
        operator_delete((void *)local_198._0_8_);
      }
      if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (puStack_1e8 != (pointer)0x0) {
        operator_delete(puStack_1e8);
      }
      if (local_208 != (pointer)0x0) {
        operator_delete(local_208);
      }
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248._0_8_;
      if (local_220 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_220);
        paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_248._0_8_;
      }
    }
    else {
      if (bVar3) {
        local_248._0_8_ = "cfdcore_descriptor.cpp";
        local_248._8_4_ = 0x492;
        local_248._16_8_ = "AnalyzeKey";
        logger::log<>((CfdSourceLocation *)local_248,kCfdLogLevelWarning,
                      "Failed to extPubkey. hardened is extPrivkey only.");
        pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
        local_248._0_8_ = puVar6;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_248,"Failed to extPubkey. hardened is extPrivkey only.","");
        CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)local_248);
        __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
      }
      ExtPubkey::ExtPubkey((ExtPubkey *)local_248,&local_1b8);
      puVar2 = local_f8.serialize_data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_f8.serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_248._0_8_;
      local_f8.serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_248._8_8_;
      local_f8.serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_248._16_8_;
      local_248._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_248._8_8_ = (pointer)0x0;
      local_248._16_8_ = (pointer)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar2 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(puVar2);
      }
      puVar2 = local_f8.chaincode_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_f8.version_ = local_248._24_4_;
      local_f8.fingerprint_ = local_248._28_4_;
      local_f8.depth_ = local_248[0x20];
      local_f8._33_3_ = local_248._33_3_;
      local_f8.child_num_ = local_248._36_4_;
      local_f8.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)local_220;
      local_f8.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = puStack_218;
      local_f8.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = local_210;
      local_220 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
      puStack_218 = (pointer)0x0;
      local_210 = (pointer)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar2 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(puVar2);
      }
      puVar2 = local_f8.pubkey_.data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_f8.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start = local_208;
      local_f8.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_finish = puStack_200;
      local_f8.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_1f8;
      local_208 = (pointer)0x0;
      puStack_200 = (pointer)0x0;
      local_1f8 = (pointer)0x0;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2);
      }
      puVar2 = local_f8.tweak_sum_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_f8.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = local_1f0;
      local_f8.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = puStack_1e8;
      local_f8.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = puStack_1e0;
      local_1f0 = (pointer)0x0;
      puStack_1e8 = (pointer)0x0;
      puStack_1e0 = (pointer)0x0;
      if ((puVar2 != (pointer)0x0) && (operator_delete(puVar2), local_1f0 != (pointer)0x0)) {
        operator_delete(local_1f0);
      }
      if (local_208 != (pointer)0x0) {
        operator_delete(local_208);
      }
      if (local_220 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_220);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete((void *)local_248._0_8_);
      }
      ::std::__cxx11::string::_M_assign((string *)&this->base_extkey_);
      if ((pointer)local_118._M_string_length != (pointer)0x0) {
        ExtPubkey::DerivePubkey((ExtPubkey *)local_248,&local_f8,&local_118);
        puVar2 = local_f8.serialize_data_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_f8.serialize_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_248._0_8_;
        local_f8.serialize_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_248._8_8_;
        local_f8.serialize_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)local_248._16_8_;
        local_248._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_248._8_8_ = (pointer)0x0;
        local_248._16_8_ = (pointer)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar2 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(puVar2);
        }
        puVar2 = local_f8.chaincode_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_f8.version_ = local_248._24_4_;
        local_f8.fingerprint_ = local_248._28_4_;
        local_f8.depth_ = local_248[0x20];
        local_f8._33_3_ = local_248._33_3_;
        local_f8.child_num_ = local_248._36_4_;
        local_f8.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)local_220;
        local_f8.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = puStack_218;
        local_f8.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = local_210;
        local_220 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
        puStack_218 = (pointer)0x0;
        local_210 = (pointer)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar2 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(puVar2);
        }
        puVar2 = local_f8.pubkey_.data_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_f8.pubkey_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = local_208;
        local_f8.pubkey_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = puStack_200;
        local_f8.pubkey_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = local_1f8;
        local_208 = (pointer)0x0;
        puStack_200 = (pointer)0x0;
        local_1f8 = (pointer)0x0;
        if (puVar2 != (pointer)0x0) {
          operator_delete(puVar2);
        }
        puVar2 = local_f8.tweak_sum_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_f8.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = local_1f0;
        local_f8.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = puStack_1e8;
        local_f8.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = puStack_1e0;
        local_1f0 = (pointer)0x0;
        puStack_1e8 = (pointer)0x0;
        puStack_1e0 = (pointer)0x0;
        if ((puVar2 != (pointer)0x0) && (operator_delete(puVar2), local_1f0 != (pointer)0x0)) {
          operator_delete(local_1f0);
        }
        if (local_208 != (pointer)0x0) {
          operator_delete(local_208);
        }
        if (local_220 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_220);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete((void *)local_248._0_8_);
        }
      }
      ExtPubkey::ToString_abi_cxx11_((string *)local_248,&local_f8);
      ::std::__cxx11::string::operator=((string *)args,(string *)local_248);
      if ((pointer)local_248._0_8_ != puVar6) {
        operator_delete((void *)local_248._0_8_);
      }
      ExtPubkey::GetPubTweakSum((ByteData256 *)local_198,&local_f8);
      ByteData256::GetHex_abi_cxx11_((string *)local_248,(ByteData256 *)local_198);
      ::std::__cxx11::string::operator=((string *)&this->tweak_sum_,(string *)local_248);
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._0_8_;
      if ((pointer)local_248._0_8_ != puVar6) {
        operator_delete((void *)local_248._0_8_);
        paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_198._0_8_;
      }
    }
    if (paVar11 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(paVar11);
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p);
    }
    if (local_f8.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f8.tweak_sum_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    _Var12._M_p = (pointer)local_f8.chaincode_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
    if (local_f8.pubkey_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f8.pubkey_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
      _Var12._M_p = (pointer)local_f8.chaincode_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start;
    }
    goto LAB_0041279d;
  }
  this->key_type_ = kDescriptorKeyPublic;
  Pubkey::Pubkey((Pubkey *)&local_f8);
  SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)&local_118);
  Privkey::Privkey((Privkey *)local_248);
  ByteData::ByteData((ByteData *)&local_1b8,(string *)args);
  bVar3 = Pubkey::IsValid((ByteData *)&local_1b8);
  if (bVar3) {
    local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar14 = local_1b8._M_string_length - (long)local_1b8._M_dataplus._M_p;
    if (uVar14 == 0) {
      puVar6 = (pointer)0x0;
      __n = 0;
    }
    else {
      if ((long)uVar14 < 0) {
        ::std::__throw_bad_alloc();
      }
      puVar6 = (pointer)operator_new(uVar14);
      __n = local_1b8._M_string_length - (long)local_1b8._M_dataplus._M_p;
    }
    local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = puVar6 + uVar14;
    local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = puVar6;
    if ((pointer)local_1b8._M_string_length != local_1b8._M_dataplus._M_p) {
      local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar6;
      memmove(puVar6,local_1b8._M_dataplus._M_p,__n);
    }
    local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar6 + __n;
    Pubkey::Pubkey((Pubkey *)local_198,&local_88);
    puVar6 = local_f8.serialize_data_.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_f8.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_198._0_8_;
    local_f8.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_198._8_8_;
    local_f8.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_198._16_8_;
    local_198._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_198._8_8_ = (pointer)0x0;
    local_198._16_8_ = (pointer)0x0;
    if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)puVar6 !=
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0) &&
       (operator_delete(puVar6),
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_198._0_8_ !=
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0)) {
      operator_delete((void *)local_198._0_8_);
    }
    if (local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    iVar4 = ::std::__cxx11::string::compare((char *)&this->parent_kind_);
    if (iVar4 == 0) {
      local_198._0_8_ = "cfdcore_descriptor.cpp";
      local_198._8_4_ = 0x4ab;
      local_198._16_8_ = "AnalyzeKey";
      logger::log<>((CfdSourceLocation *)local_198,kCfdLogLevelWarning,
                    "Failed to taproot key. taproot is xonly pubkey only.");
      pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
      local_198._0_8_ = local_198 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_198,"Failed to taproot key. taproot is xonly pubkey only.","");
      CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)local_198);
      __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
    }
    Pubkey::GetHex_abi_cxx11_((string *)local_198,(Pubkey *)&local_f8);
LAB_0041208e:
    ::std::__cxx11::string::operator=((string *)args,(string *)local_198);
    if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
      operator_delete((void *)local_198._0_8_);
    }
    _Var12._M_p = local_1b8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
LAB_004120c3:
      operator_delete(_Var12._M_p);
    }
  }
  else {
    iVar4 = ::std::__cxx11::string::compare((char *)&this->parent_kind_);
    if ((iVar4 == 0) && (sVar8 = ByteData::GetDataSize((ByteData *)&local_1b8), sVar8 == 0x20)) {
      SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)local_198,(ByteData *)&local_1b8);
      _Var12._M_p = local_118._M_dataplus._M_p;
      local_118._M_dataplus._M_p = (pointer)local_198._0_8_;
      local_118._M_string_length = local_198._8_8_;
      local_118.field_2._M_allocated_capacity = local_198._16_8_;
      local_198._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_198._8_8_ = (pointer)0x0;
      local_198._16_8_ = (pointer)0x0;
      if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)_Var12._M_p !=
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0) &&
         (operator_delete(_Var12._M_p),
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_198._0_8_ !=
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0)) {
        operator_delete((void *)local_198._0_8_);
      }
      SchnorrPubkey::CreatePubkey((Pubkey *)local_198,(SchnorrPubkey *)&local_118,false);
      puVar6 = local_f8.serialize_data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_f8.serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_198._0_8_;
      local_f8.serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_198._8_8_;
      local_f8.serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_198._16_8_;
      local_198._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_198._8_8_ = (pointer)0x0;
      local_198._16_8_ = (pointer)0x0;
      if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)puVar6 !=
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0) &&
         (operator_delete(puVar6),
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_198._0_8_ !=
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0)) {
        operator_delete((void *)local_198._0_8_);
      }
      this->key_type_ = kDescriptorKeySchnorr;
      SchnorrPubkey::GetHex_abi_cxx11_((string *)local_198,(SchnorrPubkey *)&local_118);
      goto LAB_0041208e;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    local_1d0 = true;
    local_1b8._M_dataplus._M_p = local_1b8._M_dataplus._M_p & 0xffffffff00000000;
    bVar3 = Privkey::HasWif((string *)args,(NetType *)&local_1b8,&local_1d0);
    if (bVar3) {
      Privkey::FromWif((Privkey *)local_198,(string *)args,(NetType)local_1b8._M_dataplus._M_p,
                       local_1d0);
      uVar1 = local_248._0_8_;
      local_248._0_8_ = local_198._0_8_;
      local_248._8_8_ = local_198._8_8_;
      local_248._16_8_ = local_198._16_8_;
      local_198._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_198._8_8_ = (pointer)0x0;
      local_198._16_8_ = (pointer)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)uVar1 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        local_248._24_8_ = local_198._24_8_;
      }
      else {
        operator_delete((void *)uVar1);
        local_248._24_8_ = local_198._24_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete((void *)local_198._0_8_);
        }
      }
    }
    bVar3 = Privkey::IsValid((Privkey *)local_248);
    if (!bVar3) {
      local_198._0_8_ = "cfdcore_descriptor.cpp";
      local_198._8_4_ = 0x4ce;
      local_198._16_8_ = "AnalyzeKey";
      logger::log<>((CfdSourceLocation *)local_198,kCfdLogLevelWarning,"Failed to privkey.");
      pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
      local_198._0_8_ = local_198 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"privkey invalid.","");
      CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)local_198);
      __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
    }
    Privkey::GeneratePubkey((Pubkey *)local_198,(Privkey *)local_248,local_1d0);
    puVar6 = local_f8.serialize_data_.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_f8.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_198._0_8_;
    local_f8.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_198._8_8_;
    local_f8.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_198._16_8_;
    local_198._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_198._8_8_ = (pointer)0x0;
    local_198._16_8_ = (pointer)0x0;
    if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)puVar6 !=
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0) &&
       (operator_delete(puVar6),
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_198._0_8_ !=
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0)) {
      operator_delete((void *)local_198._0_8_);
    }
    Pubkey::GetHex_abi_cxx11_((string *)local_198,(Pubkey *)&local_f8);
    ::std::__cxx11::string::operator=((string *)args,(string *)local_198);
    _Var12._M_p = (pointer)local_198._0_8_;
    if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) goto LAB_004120c3;
  }
  bVar3 = Pubkey::IsCompress((Pubkey *)&local_f8);
  this->is_uncompressed_key_ = !bVar3;
  _Var12._M_p = local_118._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete((void *)local_248._0_8_);
    _Var12._M_p = local_118._M_dataplus._M_p;
  }
LAB_0041279d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var12._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(_Var12._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.serialize_data_.data_.
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_f8.serialize_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_248._0_8_ = "cfdcore_descriptor.cpp";
  local_248._8_4_ = 0x4d7;
  local_248._16_8_ = "AnalyzeKey";
  logger::log<std::__cxx11::string&>
            ((CfdSourceLocation *)local_248,kCfdLogLevelInfo,"key_info = {}",args);
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  return;
}

Assistant:

void DescriptorNode::AnalyzeKey() {
  // key analyze
  key_info_ = value_;
  if (value_[0] == '[') {
    // key origin information check
    // cut to ']'
    auto pos = value_.find("]");
    if (pos != std::string::npos) {
      key_info_ = value_.substr(pos + 1);
    }
  }
  // derive key check (xpub,etc)
  info(CFD_LOG_SOURCE, "key_info_ = {}", key_info_);
  std::string hdkey_top;
  if (key_info_.size() > 4) {
    hdkey_top = key_info_.substr(1, 3);
  }
  if ((hdkey_top == "pub") || (hdkey_top == "prv")) {
    key_type_ = DescriptorKeyType::kDescriptorKeyBip32;
    if (hdkey_top == "prv") {
      key_type_ = DescriptorKeyType::kDescriptorKeyBip32Priv;
    }
    ExtPubkey xpub;
    std::string path;
    std::string key;
    bool hardened = false;
    std::vector<std::string> list = StringUtil::Split(key_info_, "/");
    key = list[0];
    if (list.size() > 1) {
      if (key_info_.find("*") != std::string::npos) {
        need_arg_num_ = 1;
      }
      size_t index;
      for (index = 1; index < list.size(); ++index) {
        if (list[index] == "*") break;
        if ((list[index] == "*'") || (list[index] == "*h")) {
          hardened = true;
          break;
        }
        if (index != 1) {
          path += "/";
        }
        path += list[index];
      }
      if ((index + 1) < list.size()) {
        warn(
            CFD_LOG_SOURCE,
            "Failed to extkey path. "
            "A '*' can only be specified at the end.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to extkey path. "
            "A '*' can only be specified at the end.");
      }
    }
    info(CFD_LOG_SOURCE, "key = {}, path = {}", key, path);
    if (key_type_ == DescriptorKeyType::kDescriptorKeyBip32Priv) {
      ExtPrivkey xpriv(key);
      base_extkey_ = key;
      if (!path.empty()) xpriv = xpriv.DerivePrivkey(path);
      key_info_ = xpriv.ToString();
      tweak_sum_ = xpriv.GetPubTweakSum().GetHex();
    } else if (hardened) {
      warn(
          CFD_LOG_SOURCE, "Failed to extPubkey. hardened is extPrivkey only.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to extPubkey. hardened is extPrivkey only.");
    } else {
      xpub = ExtPubkey(key);
      base_extkey_ = key;
      if (!path.empty()) xpub = xpub.DerivePubkey(path);
      key_info_ = xpub.ToString();
      tweak_sum_ = xpub.GetPubTweakSum().GetHex();
    }
  } else {
    key_type_ = DescriptorKeyType::kDescriptorKeyPublic;
    bool is_wif = false;
    Pubkey pubkey;
    SchnorrPubkey schnorr_pubkey;
    Privkey privkey;
    try {
      // pubkey format check
      ByteData bytes(key_info_);
      if (Pubkey::IsValid(bytes)) {
        // pubkey
        pubkey = Pubkey(bytes);
        if (parent_kind_ == "tr") {
          warn(
              CFD_LOG_SOURCE,
              "Failed to taproot key. taproot is xonly pubkey only.");
          throw CfdException(
              CfdError::kCfdIllegalArgumentError,
              "Failed to taproot key. taproot is xonly pubkey only.");
        }
        key_info_ = pubkey.GetHex();
      } else if (
          (parent_kind_ == "tr") &&
          (bytes.GetDataSize() == SchnorrPubkey::kSchnorrPubkeySize)) {
        // xonly pubkey
        schnorr_pubkey = SchnorrPubkey(bytes);
        pubkey = schnorr_pubkey.CreatePubkey();
        key_type_ = DescriptorKeyType::kDescriptorKeySchnorr;
        key_info_ = schnorr_pubkey.GetHex();
      } else {
        is_wif = true;
      }
    } catch (const CfdException& except) {
      std::string errmsg(except.what());
      if (errmsg.find("hex to byte convert error.") != std::string::npos) {
        is_wif = true;
      } else {
        throw except;
      }
    }
    if (is_wif) {
      // privkey WIF check
      bool is_compressed = true;
      NetType nettype = NetType::kMainnet;
      bool has_wif = Privkey::HasWif(key_info_, &nettype, &is_compressed);
      if (has_wif) {
        privkey = Privkey::FromWif(key_info_, nettype, is_compressed);
      }
      if (!privkey.IsValid()) {
        warn(CFD_LOG_SOURCE, "Failed to privkey.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "privkey invalid.");
      }
      pubkey = privkey.GeneratePubkey(is_compressed);
      key_info_ = pubkey.GetHex();
    }
    is_uncompressed_key_ = !pubkey.IsCompress();
  }
  info(CFD_LOG_SOURCE, "key_info = {}", key_info_);
}